

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

void xercesc_4_0::XMLString::removeChar(XMLCh *srcString,XMLCh *toRemove,XMLBuffer *dstBuffer)

{
  XMLCh toAppend;
  XMLCh *pXVar1;
  XMLCh *pXStack_28;
  XMLCh c;
  XMLCh *pszSrc;
  XMLBuffer *dstBuffer_local;
  XMLCh *toRemove_local;
  XMLCh *srcString_local;
  
  if (srcString != (XMLCh *)0x0) {
    XMLBuffer::reset(dstBuffer);
    pXStack_28 = srcString;
    while( true ) {
      pXVar1 = pXStack_28 + 1;
      toAppend = *pXStack_28;
      if (toAppend == L'\0') break;
      pXStack_28 = pXVar1;
      if (toAppend != *toRemove) {
        XMLBuffer::append(dstBuffer,toAppend);
      }
    }
  }
  return;
}

Assistant:

void XMLString::removeChar(const XMLCh*     const srcString
                         , const XMLCh&           toRemove
                         ,       XMLBuffer&       dstBuffer)
{
    if(!srcString) return;
    const XMLCh* pszSrc = srcString;
    XMLCh c;

    dstBuffer.reset();

    while ((c=*pszSrc++)!=0)
    {
        if (c != toRemove)
            dstBuffer.append(c);
    }
}